

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readChunkHeader(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *value;
  None NVar1;
  uint uVar2;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *pMVar3;
  SourceLocation location;
  uint uVar4;
  coroutine_handle<void> handle;
  None *pNVar5;
  None *pNVar6;
  int iVar7;
  long in_RSI;
  FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *value_00;
  ulong uVar8;
  bool bVar9;
  Fault f;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  
  handle._M_fr_ptr = operator_new(0x580);
  *(code **)handle._M_fr_ptr = readChunkHeader;
  *(code **)((long)handle._M_fr_ptr + 8) = readChunkHeader;
  this_00 = (Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)handle._M_fr_ptr + 0x10);
  _kjCondition.left =
       (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)anon_var_dwarf_9a3139;
  _kjCondition.right = (None *)s_readChunkHeader_004d5903;
  _kjCondition.op.content.ptr = (char *)0x400000060a;
  location.function = "readChunkHeader";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x60a;
  location.columnNumber = 0x40;
  kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::Coroutine
            (this_00,handle,location);
  kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::get_return_object
            ((Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)this);
  _kjCondition.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0xd8)
  ;
  bVar9 = *(long *)(in_RSI + 0xe0) == 0;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = anon_var_dwarf_43885;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = !bVar9;
  if (bVar9) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x60b,FAILED,"onMessageDone != kj::none","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  this_01 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x570);
  readHeader(this_01,(HeaderType)in_RSI,1,*(size_t *)(in_RSI + 0x30));
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)handle._M_fr_ptr + 0x278);
  co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x578) = 0;
  bVar9 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar9) {
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    await_resume((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
                 ((long)handle._M_fr_ptr + 0x470),__return_storage_ptr__);
    kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
    ~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    uVar2 = ((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
            ((long)handle._M_fr_ptr + 0x470))->tag;
    if (uVar2 == 1) {
      pNVar5 = *(None **)((long)handle._M_fr_ptr + 0x480);
      _kjCondition.right = (None *)((ulong)_kjCondition.right & 0xffffffff00000000);
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = pNVar5 != (None *)0x0;
      _kjCondition.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)pNVar5;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x615,FAILED,"text.size() > 0","_kjCondition,",
                   (DebugComparison<unsigned_long,_int> *)&_kjCondition);
        kj::_::Debug::Fault::~Fault(&f);
        pNVar5 = *(None **)((long)handle._M_fr_ptr + 0x480);
      }
      value = (FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
              ((long)handle._M_fr_ptr + 0x4f0);
      value_00 = (FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
                 ((long)handle._M_fr_ptr + 0x530);
      pMVar3 = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
               ((ArrayPtr<char> *)((long)handle._M_fr_ptr + 0x478))->ptr;
      uVar8 = 0;
      for (pNVar6 = (None *)0x0; pNVar5 != pNVar6; pNVar6 = pNVar6 + 1) {
        NVar1 = pNVar6[(long)&pMVar3->ptr];
        iVar7 = (int)(char)NVar1;
        if ((byte)((char)NVar1 - 0x30U) < 10) {
          uVar8 = uVar8 << 4 | (ulong)(iVar7 - 0x30);
        }
        else {
          if ((byte)((char)NVar1 + 0x9fU) < 6) {
            uVar4 = iVar7 - 0x57;
          }
          else {
            if (5 < (byte)((char)NVar1 + 0xbfU)) {
              _kjCondition.left = pMVar3;
              _kjCondition.right = pNVar5;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,char_const(&)[24],kj::ArrayPtr<char>&,kj::ArrayPtr<unsigned_char>>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                         ,0x620,FAILED,(char *)0x0,
                         "\"invalid HTTP chunk size\", text, text.asBytes()",
                         (char (*) [24])"invalid HTTP chunk size",
                         (ArrayPtr<char> *)((long)handle._M_fr_ptr + 0x478),
                         (ArrayPtr<unsigned_char> *)&_kjCondition);
              kj::_::Debug::Fault::~Fault(&f);
              *(undefined4 *)((long)handle._M_fr_ptr + 0x4f0) = 1;
              *(ulong *)((long)handle._M_fr_ptr + 0x4f8) = uVar8;
              kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::fulfill
                        (this_00,value);
              uVar4 = value->tag - 1;
              value_00 = value;
              goto LAB_0036afe8;
            }
            uVar4 = iVar7 - 0x37;
          }
          uVar8 = uVar8 * 0x10 + (ulong)uVar4;
        }
      }
      *(undefined4 *)((long)handle._M_fr_ptr + 0x530) = 1;
      *(ulong *)((long)handle._M_fr_ptr + 0x538) = uVar8;
      kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::fulfill
                (this_00,value_00);
      uVar4 = value_00->tag - 1;
    }
    else {
      if (uVar2 != 2) {
        kj::_::unreachable();
      }
      value_00 = (FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
                 ((long)handle._M_fr_ptr + 0x4b0);
      *(undefined4 *)((long)handle._M_fr_ptr + 0x4b0) = 2;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4b8) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x478);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4c0) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x480);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4c8) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x488);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4d0) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x490);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4d8) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x498);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4e0) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4a0);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4e8) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x4a8);
      kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::fulfill
                (this_00,value_00);
      uVar4 = value_00->tag - 1;
    }
LAB_0036afe8:
    if (uVar4 < 2) {
      value_00->tag = 0;
    }
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x578) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::OneOf<uint64_t, HttpHeaders::ProtocolError>> readChunkHeader() {
    KJ_REQUIRE(onMessageDone != kj::none);

    // We use the portion of the header after the end of message headers.
    auto textOrError = co_await readHeader(HeaderType::CHUNK, messageHeaderEnd, messageHeaderEnd);

    KJ_SWITCH_ONEOF(textOrError) {
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        co_return protocolError;
      }
      KJ_CASE_ONEOF(text, kj::ArrayPtr<char>) {
        KJ_REQUIRE(text.size() > 0) { break; }

        uint64_t value = 0;
        for (char c: text) {
          if ('0' <= c && c <= '9') {
            value = value * 16 + (c - '0');
          } else if ('a' <= c && c <= 'f') {
            value = value * 16 + (c - 'a' + 10);
          } else if ('A' <= c && c <= 'F') {
            value = value * 16 + (c - 'A' + 10);
          } else {
            KJ_FAIL_REQUIRE("invalid HTTP chunk size", text, text.asBytes()) { break; }
            co_return value;
          }
        }

        co_return value;
      }
    }

    KJ_UNREACHABLE;
  }